

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O3

void __thiscall
amrex::BaseFab<unsigned_int>::resize(BaseFab<unsigned_int> *this,Box *b,int n,Arena *ar)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Arena *pAVar4;
  Arena *pAVar5;
  long lVar6;
  
  this->nvar = n;
  uVar1 = *(undefined8 *)((b->smallend).vect + 2);
  uVar2 = *(undefined8 *)(b->bigend).vect;
  uVar3 = *(undefined8 *)((b->bigend).vect + 2);
  *(undefined8 *)(this->domain).smallend.vect = *(undefined8 *)(b->smallend).vect;
  *(undefined8 *)((this->domain).smallend.vect + 2) = uVar1;
  *(undefined8 *)(this->domain).bigend.vect = uVar2;
  *(undefined8 *)((this->domain).bigend.vect + 2) = uVar3;
  if (ar == (Arena *)0x0) {
    ar = (this->super_DataAllocator).m_arena;
  }
  pAVar4 = DataAllocator::arena(&this->super_DataAllocator);
  pAVar5 = ar;
  if (ar == (Arena *)0x0) {
    pAVar5 = The_Arena();
  }
  if (pAVar4 == pAVar5) {
    if ((this->dptr == (uint *)0x0) || (this->ptr_owner == false)) {
      if (this->shared_memory == true) {
        Abort_host("BaseFab::resize: BaseFab in shared memory cannot increase size");
      }
      this->dptr = (uint *)0x0;
    }
    else {
      lVar6 = (long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
              (long)(((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1) *
              (long)(((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) *
              (long)this->nvar;
      if (lVar6 - this->truesize == 0 || lVar6 < this->truesize) {
        return;
      }
      if (this->shared_memory == true) {
        Abort_host("BaseFab::resize: BaseFab in shared memory cannot increase size");
      }
      clear(this);
    }
  }
  else {
    clear(this);
    (this->super_DataAllocator).m_arena = ar;
  }
  define(this);
  return;
}

Assistant:

void
BaseFab<T>::resize (const Box& b, int n, Arena* ar)
{
    this->nvar   = n;
    this->domain = b;

    if (ar == nullptr) {
        ar = m_arena;
    }

    if (arena() != DataAllocator(ar).arena()) {
        clear();
        m_arena = ar;
        define();
    }
    else if (this->dptr == 0 || !this->ptr_owner)
    {
        if (this->shared_memory)
            amrex::Abort("BaseFab::resize: BaseFab in shared memory cannot increase size");

        this->dptr = nullptr;
        define();
    }
    else if (this->nvar*this->domain.numPts() > this->truesize)
    {
        if (this->shared_memory)
            amrex::Abort("BaseFab::resize: BaseFab in shared memory cannot increase size");

        clear();

        define();
    }
}